

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_0::MockOutputStream::write(MockOutputStream *this,int __fd,void *__buf,size_t __n)

{
  void *__src;
  size_t __n_00;
  uchar *puVar1;
  uchar *puVar2;
  uchar *in_RAX;
  uchar *extraout_RAX;
  undefined8 *puVar3;
  ArrayPtr<const_unsigned_char> *__begin2;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  uchar *puVar5;
  RemoveConst<unsigned_char> *__dest;
  ArrayPtr<const_unsigned_char> *piece;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    puVar3 = puVar4 + (long)__buf * 2;
    do {
      __src = (void *)*puVar4;
      __n_00 = puVar4[1];
      puVar1 = (this->bytes).builder.ptr;
      in_RAX = (this->bytes).builder.pos + (__n_00 - (long)puVar1);
      puVar2 = (this->bytes).builder.endPtr;
      puVar5 = puVar2 + -(long)puVar1;
      if (puVar5 < in_RAX) {
        puVar5 = (uchar *)((long)puVar5 * 2);
        if (puVar2 == puVar1) {
          puVar5 = &DAT_00000004;
        }
        if (puVar5 < in_RAX) {
          puVar5 = in_RAX;
        }
        Vector<unsigned_char>::setCapacity(&this->bytes,(size_t)puVar5);
        in_RAX = extraout_RAX;
      }
      __dest = (this->bytes).builder.pos;
      if (__n_00 != 0) {
        in_RAX = (uchar *)memcpy(__dest,__src,__n_00);
        __dest = __dest + __n_00;
      }
      (this->bytes).builder.pos = __dest;
      puVar4 = puVar4 + 2;
    } while (puVar4 != puVar3);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    for (auto& piece: pieces) {
      bytes.addAll(piece);
    }
  }